

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall pugi::impl::anon_unknown_0::xpath_lexer::next(xpath_lexer *this)

{
  byte bVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte *pbVar4;
  lexeme_t lVar5;
  bool bVar6;
  
  pbVar4 = (byte *)(this->_cur + -2);
  do {
    pbVar2 = pbVar4;
    pbVar4 = pbVar2 + 1;
  } while (((anonymous_namespace)::chartype_table[pbVar2[2]] & 8) != 0);
  pbVar3 = pbVar2 + 2;
  this->_cur_lexeme_pos = (char_t *)pbVar3;
  bVar1 = pbVar2[2];
  if (0x5a < bVar1) {
    if (bVar1 == 0x5b) {
      pbVar4 = pbVar2 + 3;
      lVar5 = lex_open_square_brace;
      goto LAB_003590f3;
    }
    if (bVar1 == 0x5d) {
      pbVar4 = pbVar2 + 3;
      lVar5 = lex_close_square_brace;
      goto LAB_003590f3;
    }
    if (bVar1 == 0x7c) {
      pbVar4 = pbVar2 + 3;
      lVar5 = lex_union;
      goto LAB_003590f3;
    }
    goto switchD_00358ece_caseD_23;
  }
  switch(bVar1) {
  case 0x21:
    lVar5 = (uint)(pbVar2[3] == 0x3d) * 2;
    pbVar4 = pbVar4 + (ulong)lVar5 + 1;
    break;
  case 0x22:
  case 0x27:
    (this->_cur_lexeme_contents).begin = (char_t *)(pbVar2 + 3);
    do {
      pbVar4 = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
      if (*pbVar4 == 0) break;
    } while (*pbVar4 != bVar1);
    (this->_cur_lexeme_contents).end = (char_t *)pbVar3;
    lVar5 = lex_quoted_string;
    if (*pbVar3 == 0) {
      lVar5 = lex_none;
    }
    pbVar4 = pbVar3 + (*pbVar3 != 0);
    break;
  case 0x24:
    pbVar4 = pbVar2 + 3;
    if (((anonymous_namespace)::chartypex_table[pbVar2[3]] & 4) == 0) {
      lVar5 = lex_none;
    }
    else {
      (this->_cur_lexeme_contents).begin = (char_t *)pbVar4;
      do {
        pbVar4 = pbVar3;
        pbVar3 = pbVar4 + 1;
      } while (((anonymous_namespace)::chartypex_table[pbVar4[1]] & 0x10) != 0);
      if (pbVar4[1] == 0x3a) {
        bVar1 = pbVar4[2];
        while (((anonymous_namespace)::chartypex_table[bVar1] & 0x10) != 0) {
          bVar1 = pbVar3[1];
          pbVar3 = pbVar3 + 1;
        }
      }
      (this->_cur_lexeme_contents).end = (char_t *)pbVar3;
      lVar5 = lex_var_ref;
      pbVar4 = pbVar3;
    }
    break;
  case 0x28:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_open_brace;
    break;
  case 0x29:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_close_brace;
    break;
  case 0x2a:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_multiply;
    break;
  case 0x2b:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_plus;
    break;
  case 0x2c:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_comma;
    break;
  case 0x2d:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_minus;
    break;
  case 0x2e:
    if ((ulong)pbVar2[3] == 0x2e) {
      pbVar4 = pbVar2 + 4;
      lVar5 = lex_double_dot;
    }
    else if ((ulong)pbVar2[3] - 0x3a < 0xfffffffffffffff6) {
      pbVar4 = pbVar2 + 3;
      lVar5 = lex_dot;
    }
    else {
      (this->_cur_lexeme_contents).begin = (char_t *)pbVar3;
      do {
        pbVar4 = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      } while (0xfffffffffffffff5 < (ulong)*pbVar4 - 0x3a);
      (this->_cur_lexeme_contents).end = (char_t *)pbVar3;
      lVar5 = lex_number;
      pbVar4 = pbVar3;
    }
    break;
  case 0x2f:
    pbVar4 = pbVar2 + 3;
    if (pbVar2[3] == 0x2f) {
      pbVar4 = pbVar2 + 4;
    }
    lVar5 = pbVar2[3] == 0x2f | lex_slash;
    break;
  case 0x3a:
    lVar5 = lex_double_colon;
    if (pbVar2[3] != 0x3a) {
      lVar5 = lex_none;
    }
    pbVar4 = pbVar4 + (ulong)(pbVar2[3] == 0x3a) * 2 + 1;
    break;
  case 0x3c:
    bVar6 = pbVar2[3] == 0x3d;
    lVar5 = bVar6 + 3 + (uint)bVar6;
    goto LAB_0035904f;
  case 0x3d:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_equal;
    break;
  case 0x3e:
    bVar6 = pbVar2[3] == 0x3d;
    lVar5 = bVar6 + 4 + (uint)bVar6;
LAB_0035904f:
    pbVar4 = pbVar2 + 3;
    if (bVar6) {
      pbVar4 = pbVar2 + 4;
    }
    break;
  case 0x40:
    pbVar4 = pbVar2 + 3;
    lVar5 = lex_axis_attribute;
    break;
  default:
    if (bVar1 == 0) {
      lVar5 = lex_eof;
      pbVar4 = pbVar3;
      break;
    }
  case 0x23:
  case 0x25:
  case 0x26:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x3f:
switchD_00358ece_caseD_23:
    if (((anonymous_namespace)::chartypex_table[bVar1] & 8) == 0) {
      if (((anonymous_namespace)::chartypex_table[bVar1] & 4) == 0) {
        lVar5 = lex_none;
        pbVar4 = pbVar3;
      }
      else {
        (this->_cur_lexeme_contents).begin = (char_t *)pbVar3;
        pbVar4 = pbVar2 + 3;
        do {
          pbVar2 = pbVar4;
          pbVar4 = pbVar2 + 1;
        } while (((anonymous_namespace)::chartypex_table[pbVar2[-1]] & 0x10) != 0);
        pbVar4 = pbVar2 + -1;
        if ((pbVar2[-1] == 0x3a) && (pbVar4 = pbVar2 + 1, (ulong)*pbVar2 != 0x2a)) {
          bVar1 = (anonymous_namespace)::chartypex_table[*pbVar2];
          pbVar4 = pbVar2 + -1;
          while ((bVar1 & 0x10) != 0) {
            pbVar2 = pbVar4 + 1;
            pbVar4 = pbVar4 + 1;
            bVar1 = (anonymous_namespace)::chartypex_table[*pbVar2];
          }
        }
        (this->_cur_lexeme_contents).end = (char_t *)pbVar4;
        lVar5 = lex_string;
      }
    }
    else {
      (this->_cur_lexeme_contents).begin = (char_t *)pbVar3;
      do {
        pbVar2 = pbVar4 + 1;
        pbVar4 = pbVar4 + 1;
      } while (0xfffffffffffffff5 < (ulong)*pbVar2 - 0x3a);
      if (*pbVar2 == 0x2e) {
        do {
          pbVar2 = pbVar4 + 1;
          pbVar4 = pbVar4 + 1;
        } while (0xfffffffffffffff5 < (ulong)*pbVar2 - 0x3a);
      }
      (this->_cur_lexeme_contents).end = (char_t *)pbVar4;
      lVar5 = lex_number;
    }
  }
LAB_003590f3:
  this->_cur_lexeme = lVar5;
  this->_cur = (char_t *)pbVar4;
  return;
}

Assistant:

void next()
		{
			const char_t* cur = _cur;

			while (PUGI_IMPL_IS_CHARTYPE(*cur, ct_space)) ++cur;

			// save lexeme position for error reporting
			_cur_lexeme_pos = cur;

			switch (*cur)
			{
			case 0:
				_cur_lexeme = lex_eof;
				break;

			case '>':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_greater_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_greater;
				}
				break;

			case '<':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_less_or_equal;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_less;
				}
				break;

			case '!':
				if (*(cur+1) == '=')
				{
					cur += 2;
					_cur_lexeme = lex_not_equal;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			case '=':
				cur += 1;
				_cur_lexeme = lex_equal;

				break;

			case '+':
				cur += 1;
				_cur_lexeme = lex_plus;

				break;

			case '-':
				cur += 1;
				_cur_lexeme = lex_minus;

				break;

			case '*':
				cur += 1;
				_cur_lexeme = lex_multiply;

				break;

			case '|':
				cur += 1;
				_cur_lexeme = lex_union;

				break;

			case '$':
				cur += 1;

				if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':' && PUGI_IMPL_IS_CHARTYPEX(cur[1], ctx_symbol)) // qname
					{
						cur++; // :

						while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_var_ref;
				}
				else
				{
					_cur_lexeme = lex_none;
				}

				break;

			case '(':
				cur += 1;
				_cur_lexeme = lex_open_brace;

				break;

			case ')':
				cur += 1;
				_cur_lexeme = lex_close_brace;

				break;

			case '[':
				cur += 1;
				_cur_lexeme = lex_open_square_brace;

				break;

			case ']':
				cur += 1;
				_cur_lexeme = lex_close_square_brace;

				break;

			case ',':
				cur += 1;
				_cur_lexeme = lex_comma;

				break;

			case '/':
				if (*(cur+1) == '/')
				{
					cur += 2;
					_cur_lexeme = lex_double_slash;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_slash;
				}
				break;

			case '.':
				if (*(cur+1) == '.')
				{
					cur += 2;
					_cur_lexeme = lex_double_dot;
				}
				else if (PUGI_IMPL_IS_CHARTYPEX(*(cur+1), ctx_digit))
				{
					_cur_lexeme_contents.begin = cur; // .

					++cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else
				{
					cur += 1;
					_cur_lexeme = lex_dot;
				}
				break;

			case '@':
				cur += 1;
				_cur_lexeme = lex_axis_attribute;

				break;

			case '"':
			case '\'':
			{
				char_t terminator = *cur;

				++cur;

				_cur_lexeme_contents.begin = cur;
				while (*cur && *cur != terminator) cur++;
				_cur_lexeme_contents.end = cur;

				if (!*cur)
					_cur_lexeme = lex_none;
				else
				{
					cur += 1;
					_cur_lexeme = lex_quoted_string;
				}

				break;
			}

			case ':':
				if (*(cur+1) == ':')
				{
					cur += 2;
					_cur_lexeme = lex_double_colon;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
				break;

			default:
				if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;

					if (*cur == '.')
					{
						cur++;

						while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_digit)) cur++;
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_number;
				}
				else if (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_start_symbol))
				{
					_cur_lexeme_contents.begin = cur;

					while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;

					if (cur[0] == ':')
					{
						if (cur[1] == '*') // namespace test ncname:*
						{
							cur += 2; // :*
						}
						else if (PUGI_IMPL_IS_CHARTYPEX(cur[1], ctx_symbol)) // namespace test qname
						{
							cur++; // :

							while (PUGI_IMPL_IS_CHARTYPEX(*cur, ctx_symbol)) cur++;
						}
					}

					_cur_lexeme_contents.end = cur;

					_cur_lexeme = lex_string;
				}
				else
				{
					_cur_lexeme = lex_none;
				}
			}

			_cur = cur;
		}